

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeCallsPass.h
# Opt level: O0

CallInst * anon_unknown.dwarf_1e891::MergeCalls::mergeCallSites(Function *F,Function *Target)

{
  size_t *this;
  BasicBlock *pBVar1;
  bool bVar2;
  reference this_00;
  Function *pFVar3;
  size_type sVar4;
  reference ppCVar5;
  LLVMContext *pLVar6;
  Instruction *I_00;
  mapped_type *ppBVar7;
  size_t sVar8;
  Type *pTVar9;
  reference ppCVar10;
  Value *pVVar11;
  mapped_type *ppBVar12;
  FunctionType *this_01;
  ret_type Ty;
  PHINode *pPVar13;
  BasicBlock *pBVar14;
  size_type sVar15;
  SwitchInst *pSVar16;
  uint64_t val;
  iterator_range<llvm::Argument_*> iVar17;
  ArrayRef<llvm::Value_*> Args;
  BasicBlock *in_stack_fffffffffffffb48;
  APInt local_328;
  BasicBlock *local_318;
  ConstantInt *BranchIdx;
  pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*> *KV;
  iterator __end2_3;
  iterator __begin2_3;
  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
  *__range2_3;
  int switchCtr;
  SwitchInst *SwitchBackInstr;
  PHINode *local_2b8;
  PHINode *WhereFromNode;
  Value *local_2a8;
  CallInst *C_3;
  iterator __end2_2;
  iterator __begin2_2;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *__range2_2;
  Value *local_260;
  Value **local_258;
  Instruction *local_250;
  CallInst *UnifiedCall;
  CallBase *local_240;
  CallBase *local_238;
  CallInst *C_2;
  iterator __end4;
  iterator __begin4;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *__range4;
  PHINode *local_1f0;
  PHINode *ArgNode;
  Argument *A;
  Argument *__end3_1;
  Argument *__begin3_1;
  Argument *local_1c8;
  iterator_range<llvm::Argument_*> *local_1c0;
  iterator_range<llvm::Argument_*> *__range3_1;
  undefined8 uStack_1b0;
  int argCtr;
  BranchInst *local_1a8;
  BranchInst *B;
  Twine local_198;
  BasicBlock *local_170;
  BasicBlock *ReturnBlock;
  BasicBlock *ParentBlock;
  CallInst *C_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *__range2_1;
  Twine *local_118;
  BasicBlock *CallBlock;
  map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToOrigParent;
  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToRet;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> CallArgs;
  CallBase *local_90;
  CallInst *C;
  Instruction *I;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *BB;
  iterator __end2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_48;
  iterator __begin2;
  Function *__range2;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> CallSites;
  Function *Target_local;
  Function *F_local;
  
  CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Target;
  std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::vector
            ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
  __begin2.NodePtr = (node_pointer)F;
  local_48.NodePtr = (node_pointer)llvm::Function::begin(F);
  BB = (BasicBlock *)llvm::Function::end((Function *)__begin2.NodePtr);
  while (bVar2 = llvm::operator!=(&local_48,
                                  (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                   *)&BB), bVar2) {
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
              ::operator*(&local_48);
    __end3 = llvm::BasicBlock::begin(this_00);
    I = (Instruction *)llvm::BasicBlock::end(this_00);
    while (bVar2 = llvm::operator!=(&__end3,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                             *)&I), bVar2) {
      C = (CallInst *)
          llvm::
          ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
          ::operator*(&__end3);
      local_90 = &llvm::dyn_cast<llvm::CallInst,llvm::Instruction>((Instruction *)C)->super_CallBase
      ;
      if (((local_90 != (CallBase *)0x0) && (bVar2 = llvm::CallBase::isInlineAsm(local_90), !bVar2))
         && (pFVar3 = llvm::CallBase::getCalledFunction(local_90),
            pFVar3 == (Function *)
                      CallSites.
                      super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)) {
        std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::push_back
                  ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2,
                   (value_type *)&local_90);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++(&__end3);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++(&local_48);
  }
  sVar4 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::size
                    ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
  if (sVar4 == 0) {
    F_local = (Function *)0x0;
  }
  else {
    sVar4 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::size
                      ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
    if (sVar4 == 1) {
      ppCVar5 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::operator[]
                          ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2,
                           0);
      F_local = (Function *)*ppCVar5;
    }
    else {
      std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
                ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                 &CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
      ::map((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
             *)&CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
      ::map((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
             *)&CallBlock);
      pLVar6 = (LLVMContext *)llvm::Function::getContext();
      llvm::Twine::Twine((Twine *)&__range2_1,"");
      local_118 = (Twine *)llvm::BasicBlock::Create(pLVar6,(Twine *)&__range2_1,F,(BasicBlock *)0x0)
      ;
      __end2_1 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::begin
                           ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2
                           );
      C_1 = (CallInst *)
            std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::end
                      ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                                 *)&C_1), bVar2) {
        ppCVar10 = __gnu_cxx::
                   __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                   ::operator*(&__end2_1);
        ParentBlock = (BasicBlock *)*ppCVar10;
        pBVar14 = llvm::Instruction::getParent((Instruction *)ParentBlock);
        ReturnBlock = pBVar14;
        I_00 = llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getNextNode
                         ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)
                          (ParentBlock + 0x18));
        llvm::Twine::Twine(&local_198,"");
        local_170 = llvm::BasicBlock::splitBasicBlock(pBVar14,I_00,&local_198,false);
        pBVar1 = ReturnBlock;
        B = (BranchInst *)ParentBlock;
        ppBVar12 = std::
                   map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                   ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                 *)&CallBlock,(key_type *)&B);
        pBVar14 = local_170;
        *ppBVar12 = pBVar1;
        ppBVar7 = std::
                  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                  ::operator[]((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                                *)&CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,&ReturnBlock);
        pBVar1 = ParentBlock;
        *ppBVar7 = pBVar14;
        llvm::BasicBlock::getFirstNonPHI(local_170);
        llvm::Instruction::moveBefore((Instruction *)pBVar1);
        local_1a8 = llvm::BranchInst::Create((BasicBlock *)local_118,ReturnBlock);
        llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getPrevNode
                  ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)(local_1a8 + 0x18)
                  );
        uStack_1b0 = llvm::Instruction::eraseFromParent();
        __gnu_cxx::
        __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
        ::operator++(&__end2_1);
      }
      sVar8 = llvm::Function::arg_size
                        ((Function *)
                         CallSites.
                         super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar8 != 0) {
        __range3_1._4_4_ = 0;
        iVar17 = llvm::Function::args
                           ((Function *)
                            CallSites.
                            super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_1c8 = iVar17.end_iterator;
        __begin3_1 = iVar17.begin_iterator;
        local_1c0 = (iterator_range<llvm::Argument_*> *)&__begin3_1;
        __end3_1 = llvm::iterator_range<llvm::Argument_*>::begin(local_1c0);
        A = llvm::iterator_range<llvm::Argument_*>::end(local_1c0);
        for (; __end3_1 != A; __end3_1 = __end3_1 + 0x28) {
          ArgNode = (PHINode *)__end3_1;
          pTVar9 = llvm::Value::getType((Value *)__end3_1);
          sVar4 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::size
                            ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)
                             &__range2);
          llvm::Twine::Twine((Twine *)&__range4,"");
          local_1f0 = llvm::PHINode::Create
                                (pTVar9,(uint)sVar4,(Twine *)&__range4,(BasicBlock *)local_118);
          __end4 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::begin
                             ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)
                              &__range2);
          C_2 = (CallInst *)
                std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::end
                          ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2)
          ;
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                                             *)&C_2), bVar2) {
            ppCVar10 = __gnu_cxx::
                       __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                       ::operator*(&__end4);
            pPVar13 = local_1f0;
            local_238 = &(*ppCVar10)->super_CallBase;
            pVVar11 = llvm::CallBase::getArgOperand(local_238,__range3_1._4_4_);
            local_240 = local_238;
            ppBVar12 = std::
                       map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                       ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                     *)&CallBlock,(key_type *)&local_240);
            llvm::PHINode::addIncoming(pPVar13,pVVar11,*ppBVar12);
            __gnu_cxx::
            __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
            ::operator++(&__end4);
          }
          UnifiedCall = (CallInst *)llvm::cast<llvm::Value,llvm::PHINode>(local_1f0);
          std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
                    ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                     &CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (value_type *)&UnifiedCall);
          __range3_1._4_4_ = __range3_1._4_4_ + 1;
        }
      }
      this_01 = llvm::Function::getFunctionType
                          ((Function *)
                           CallSites.
                           super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      Ty = llvm::cast<llvm::Value,llvm::Function>
                     ((Function *)
                      CallSites.
                      super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      llvm::ArrayRef<llvm::Value*>::ArrayRef<std::allocator<llvm::Value*>>
                ((ArrayRef<llvm::Value*> *)&local_260,
                 (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                 &CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count);
      llvm::Twine::Twine((Twine *)&__range2_2,"");
      Args.Length = (size_type)&__range2_2;
      Args.Data = local_258;
      local_250 = (Instruction *)
                  llvm::CallInst::Create
                            ((CallInst *)this_01,(FunctionType *)Ty,local_260,Args,local_118,
                             in_stack_fffffffffffffb48);
      __end2_2 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::begin
                           ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2
                           );
      C_3 = (CallInst *)
            std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::end
                      ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                                 *)&C_3), bVar2) {
        ppCVar10 = __gnu_cxx::
                   __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
                   ::operator*(&__end2_2);
        local_2a8 = (Value *)*ppCVar10;
        llvm::Value::replaceAllUsesWith(local_2a8);
        WhereFromNode = (PHINode *)llvm::Instruction::eraseFromParent();
        __gnu_cxx::
        __normal_iterator<llvm::CallInst_**,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
        ::operator++(&__end2_2);
      }
      pLVar6 = (LLVMContext *)llvm::Function::getContext();
      pTVar9 = (Type *)llvm::Type::getInt32Ty(pLVar6);
      sVar4 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::size
                        ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
      llvm::Twine::Twine((Twine *)&SwitchBackInstr,"");
      pPVar13 = llvm::PHINode::Create(pTVar9,(uint)sVar4,(Twine *)&SwitchBackInstr,local_250);
      local_2b8 = pPVar13;
      pBVar14 = getUnreachableBlock(F);
      sVar15 = std::
               map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
               ::size((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                       *)&CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pSVar16 = llvm::SwitchInst::Create
                          ((Value *)pPVar13,pBVar14,(uint)sVar15,(BasicBlock *)local_118);
      __range2_3._4_4_ = 0;
      this = &CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end2_3 = std::
                 map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                 ::begin((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                          *)this);
      KV = (pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*> *)
           std::
           map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
           ::end((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                  *)this);
      while (bVar2 = std::operator!=(&__end2_3,(_Self *)&KV), bVar2) {
        BranchIdx = (ConstantInt *)
                    std::_Rb_tree_iterator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>
                    ::operator*(&__end2_3);
        pLVar6 = (LLVMContext *)llvm::Function::getContext();
        val = (uint64_t)__range2_3._4_4_;
        __range2_3._4_4_ = __range2_3._4_4_ + 1;
        llvm::APInt::APInt(&local_328,0x20,val,true);
        pVVar11 = (Value *)llvm::ConstantInt::get(pLVar6,&local_328);
        llvm::APInt::~APInt(&local_328);
        local_318 = (BasicBlock *)pVVar11;
        llvm::PHINode::addIncoming(local_2b8,pVVar11,*(BasicBlock **)BranchIdx);
        llvm::SwitchInst::addCase((ConstantInt *)pSVar16,local_318);
        std::_Rb_tree_iterator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>::operator++
                  (&__end2_3);
      }
      F_local = (Function *)local_250;
      std::
      map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
      ::~map((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
              *)&CallBlock);
      std::
      map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
      ::~map((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
              *)&CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
                ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                 &CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::~vector
            ((vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *)&__range2);
  return (CallInst *)F_local;
}

Assistant:

static CallInst *mergeCallSites(Function *F, Function *Target) {
    std::vector<CallInst *> CallSites;

    for (BasicBlock &BB : *F) {
      for (Instruction &I : BB) {
        if (auto *C = dyn_cast<CallInst>(&I)) {
          if (!C->isInlineAsm() && C->getCalledFunction() == Target) {
            CallSites.push_back(C);
          }
        }
      }
    }

    // If T isn't actually called, do nothing.
    if (!CallSites.size())
      return nullptr;

    // Also do nothing if T is already called only once.
    if (CallSites.size() == 1)
      return CallSites[0];

    std::vector<Value *> CallArgs;
    std::map<BasicBlock *, BasicBlock *> CallSiteToRet;
    std::map<Instruction *, BasicBlock *> CallSiteToOrigParent;
    BasicBlock *CallBlock = BasicBlock::Create(F->getContext(), "", F, nullptr);

    for (CallInst *C : CallSites) {
      BasicBlock *ParentBlock = C->getParent();
      BasicBlock *ReturnBlock =
          ParentBlock->splitBasicBlock(C->getNextNode(), "");
      CallSiteToOrigParent[C] = ParentBlock;
      CallSiteToRet[ParentBlock] = ReturnBlock;

      // Move the call instruction to the beginning of the return block
      // (before the first non-PHI instruction).
      C->moveBefore(ReturnBlock->getFirstNonPHI());

      // Generate a branch to our call block and get rid of the branch
      // generated by splitBasicBlock.
      BranchInst *B = BranchInst::Create(CallBlock, ParentBlock);
      B->getPrevNode()->eraseFromParent();
    }

    if (Target->arg_size() > 0) {
      // We have to create a PHI node for each incoming basic block/value
      // pair.
      int argCtr = 0;
      for (Argument &A : Target->args()) {
        PHINode *ArgNode =
            PHINode::Create(A.getType(), CallSites.size(), "", CallBlock);
        for (CallInst *C : CallSites) {
          ArgNode->addIncoming(C->getArgOperand(argCtr),
                               CallSiteToOrigParent[C]);
        }

        CallArgs.push_back(cast<Value>(ArgNode));
        ++argCtr;
      }
    }

    // This is the actual call to the target
    CallInst *UnifiedCall = CallInst::Create(
        Target->getFunctionType(),
        cast<Value>(Target), ArrayRef<Value *>(CallArgs), "", CallBlock);

    for (CallInst *C : CallSites) {
      // Get rid of the original call, replace all references to it with the
      // call in our call block.
      C->replaceAllUsesWith(UnifiedCall);
      C->eraseFromParent();
    }

    // Emit PHI/switch instructions for branching back to the return blocks:
    PHINode *WhereFromNode = PHINode::Create(Type::getInt32Ty(F->getContext()),
                                             CallSites.size(), "", UnifiedCall);
    // Our default is gonna be a basic block that only contains an
    // 'unreachable' instruction, because we're accounting for every case.
    SwitchInst *SwitchBackInstr = SwitchInst::Create(
        WhereFromNode, getUnreachableBlock(F), CallSiteToRet.size(), CallBlock);

    int switchCtr = 0;
    for (auto &KV : CallSiteToRet) {
      llvm::ConstantInt *BranchIdx = llvm::ConstantInt::get(
          F->getContext(), llvm::APInt(32, switchCtr++, true));
      WhereFromNode->addIncoming(BranchIdx, KV.first);
      SwitchBackInstr->addCase(BranchIdx, KV.second);
    }

    return UnifiedCall;
  }